

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

void __thiscall
google::protobuf::util::MessageDifferencer::StreamReporter::~StreamReporter(StreamReporter *this)

{
  Printer *this_00;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__StreamReporter_004b1a98;
  if (this->delete_printer_ == true) {
    this_00 = this->printer_;
    if (this_00 != (Printer *)0x0) {
      io::Printer::~Printer(this_00);
    }
    operator_delete(this_00,0x130);
  }
  std::
  unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ::~unique_ptr(&(this->unpack_any_field_).dynamic_message_factory_);
  return;
}

Assistant:

MessageDifferencer::StreamReporter::~StreamReporter() {
  if (delete_printer_) delete printer_;
}